

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

int __thiscall
array<CSkins::CSkinPart,_allocator_default<CSkins::CSkinPart>_>::add
          (array<CSkins::CSkinPart,_allocator_default<CSkins::CSkinPart>_> *this,CSkinPart *item)

{
  int new_len;
  uint uVar1;
  uint uVar2;
  long lVar3;
  CSkinPart *pCVar4;
  byte bVar5;
  
  bVar5 = 0;
  uVar2 = this->list_size;
  uVar1 = this->num_elements;
  if (uVar1 == uVar2) {
    uVar2 = 1;
    if (1 < (int)uVar1) {
      uVar2 = uVar1 >> 1;
    }
    alloc(this,uVar2 + uVar1);
    uVar2 = this->list_size;
    uVar1 = this->num_elements;
  }
  new_len = uVar1 + 1;
  if ((int)uVar2 <= (int)uVar1) {
    alloc(this,new_len);
  }
  this->num_elements = new_len;
  pCVar4 = this->list + (long)new_len + -1;
  for (lVar3 = 0x1f; lVar3 != 0; lVar3 = lVar3 + -1) {
    pCVar4->m_Flags = item->m_Flags;
    item = (CSkinPart *)((long)item + (ulong)bVar5 * -8 + 4);
    pCVar4 = (CSkinPart *)((long)pCVar4 + ((ulong)bVar5 * -2 + 1) * 4);
  }
  return this->num_elements + -1;
}

Assistant:

int add(const T& item)
	{
		incsize();
		set_size(size()+1);
		list[num_elements-1] = item;
		return num_elements-1;
	}